

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O0

void __thiscall PressDelayHandler::sendMouseEvent(PressDelayHandler *this,QMouseEvent *me,int flags)

{
  bool bVar1;
  Type TVar2;
  MouseButton MVar3;
  QFlagsStorage<Qt::KeyboardModifier> QVar4;
  MouseEventSource MVar5;
  QWidget *pQVar6;
  QGraphicsView *pQVar7;
  QGraphicsScene *pQVar8;
  QWidget *this_00;
  QPointingDevice *pQVar9;
  uint in_EDX;
  QEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *gv;
  QGraphicsItem *grabber;
  QMouseEvent copy;
  QFlagsStorage<Qt::MouseButton> in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  QWidget *in_stack_fffffffffffffe90;
  QGraphicsItem *local_140;
  QPointF local_e8;
  QPointF local_d8;
  QPointF local_c8;
  QPointF local_b8;
  QPointF local_a8;
  QMouseEvent local_98 [136];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa7fa5e);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x20) = 1;
    local_140 = (QGraphicsItem *)0x0;
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa7fa82);
    pQVar6 = QWidget::parentWidget((QWidget *)0xa7fa8a);
    if (pQVar6 != (QWidget *)0x0) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa7fa9e);
      QWidget::parentWidget((QWidget *)0xa7faa6);
      pQVar7 = qobject_cast<QGraphicsView*>((QObject *)0xa7faae);
      if ((pQVar7 != (QGraphicsView *)0x0) &&
         (pQVar8 = QGraphicsView::scene
                             ((QGraphicsView *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)),
         pQVar8 != (QGraphicsScene *)0x0)) {
        QGraphicsView::scene
                  ((QGraphicsView *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        local_140 = QGraphicsScene::mouseGrabberItem
                              ((QGraphicsScene *)
                               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      }
    }
    if ((local_140 != (QGraphicsItem *)0x0) && ((in_EDX & 1) != 0)) {
      QGraphicsItem::ungrabMouse
                ((QGraphicsItem *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68.i));
    }
    if (in_RSI != (QEvent *)0x0) {
      memset(local_98,0xaa,0x50);
      TVar2 = QEvent::type(in_RSI);
      pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa7fbed);
      local_b8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7fbfc);
      local_a8 = QWidget::mapFromGlobal(in_stack_fffffffffffffe90,(QPointF *)pQVar6);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa7fc40);
      this_00 = QWidget::topLevelWidget((QWidget *)0xa7fc48);
      local_d8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7fc57);
      local_c8 = QWidget::mapFromGlobal(this_00,(QPointF *)pQVar6);
      local_e8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7fc97);
      MVar3 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
      in_stack_fffffffffffffe68.i =
           (Int)QSinglePointEvent::buttons
                          ((QSinglePointEvent *)
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      QVar4.i = (Int)QInputEvent::modifiers
                               ((QInputEvent *)
                                CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      MVar5 = QMouseEvent::source();
      pQVar9 = (QPointingDevice *)QPointerEvent::pointingDevice();
      QMouseEvent::QMouseEvent
                (local_98,TVar2,(QPointF *)&local_a8,(QPointF *)&local_c8,(QPointF *)&local_e8,MVar3
                 ,(QFlags_conflict1 *)
                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68.i),
                 (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffe74,QVar4.i),MVar5,pQVar9);
      QInputEvent::timestamp((QInputEvent *)in_RSI);
      QPointerEvent::setTimestamp((ulonglong)local_98);
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0xa7fd61);
      qt_sendSpontaneousEvent
                ((QObject *)CONCAT44(in_stack_fffffffffffffe74,QVar4.i),
                 (QEvent *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68.i));
      QMouseEvent::~QMouseEvent(local_98);
    }
    if ((local_140 != (QGraphicsItem *)0x0) && ((in_EDX & 2) != 0)) {
      QGraphicsItem::grabMouse
                ((QGraphicsItem *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68.i));
    }
    *(undefined1 *)(in_RDI + 0x20) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void sendMouseEvent(QMouseEvent *me, int flags = 0)
    {
        if (mouseTarget) {
            sendingEvent = true;

#if QT_CONFIG(graphicsview)
            QGraphicsItem *grabber = nullptr;
            if (mouseTarget->parentWidget()) {
                if (QGraphicsView *gv = qobject_cast<QGraphicsView *>(mouseTarget->parentWidget())) {
                    if (gv->scene())
                        grabber = gv->scene()->mouseGrabberItem();
                }
            }

            if (grabber && (flags & UngrabMouseBefore)) {
                // GraphicsView Mouse Handling Workaround #1:
                // we need to ungrab the mouse before re-sending the press,
                // since the scene had already set the mouse grabber to the
                // original (and consumed) event's receiver
                qFGDebug() << "QFG: ungrabbing" << grabber;
                grabber->ungrabMouse();
            }
#else
            Q_UNUSED(flags);
#endif // QT_CONFIG(graphicsview)

            if (me) {
                QMouseEvent copy(me->type(), mouseTarget->mapFromGlobal(me->globalPosition()),
                                 mouseTarget->topLevelWidget()->mapFromGlobal(me->globalPosition()), me->globalPosition(),
                                 me->button(), me->buttons(), me->modifiers(),
                                 me->source(), me->pointingDevice());
                copy.setTimestamp(me->timestamp());
                qt_sendSpontaneousEvent(mouseTarget, &copy);
            }

#if QT_CONFIG(graphicsview)
            if (grabber && (flags & RegrabMouseAfterwards)) {
                // GraphicsView Mouse Handling Workaround #2:
                // we need to re-grab the mouse after sending a faked mouse
                // release, since we still need the mouse moves for the gesture
                // (the scene will clear the item's mouse grabber status on
                // release).
                qFGDebug() << "QFG: re-grabbing" << grabber;
                grabber->grabMouse();
            }
#endif
            sendingEvent = false;
        }
    }